

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

int lws_add_http_header_by_token
              (lws *wsi,lws_token_indexes token,uchar *value,int length,uchar **p,uchar *end)

{
  int iVar1;
  uchar *name_00;
  uchar *name;
  uchar *end_local;
  uchar **p_local;
  int length_local;
  uchar *value_local;
  lws_token_indexes token_local;
  lws *wsi_local;
  
  iVar1 = lws_wsi_is_h2(wsi);
  if (iVar1 == 0) {
    name_00 = lws_token_to_string(token);
    if (name_00 == (uchar *)0x0) {
      wsi_local._4_4_ = 1;
    }
    else {
      wsi_local._4_4_ = lws_add_http_header_by_name(wsi,name_00,value,length,p,end);
    }
  }
  else {
    wsi_local._4_4_ = lws_add_http2_header_by_token(wsi,token,value,length,p,end);
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_add_http_header_by_token(struct lws *wsi, enum lws_token_indexes token,
			     const unsigned char *value, int length,
			     unsigned char **p, unsigned char *end)
{
	const unsigned char *name;
#ifdef LWS_WITH_HTTP2
	if (lws_wsi_is_h2(wsi))
		return lws_add_http2_header_by_token(wsi, token, value,
						     length, p, end);
#endif
	name = lws_token_to_string(token);
	if (!name)
		return 1;

	return lws_add_http_header_by_name(wsi, name, value, length, p, end);
}